

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::TrimCapabilitiesPass::TrimUnrequiredCapabilities
          (TrimCapabilitiesPass *this,CapabilitySet *required_capabilities)

{
  CapabilitySet *this_00;
  IRContext *this_01;
  bool bVar1;
  Capability capability_00;
  long lVar2;
  FeatureManager *pFVar3;
  size_t sVar4;
  Capability capability;
  iterator __begin2;
  CapabilitySet capabilities_to_trim;
  iterator __begin2_1;
  Capability local_9c;
  iterator local_98;
  CapabilitySet *local_80;
  EnumSet<spv::Capability> local_78;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_50;
  
  this_01 = (this->super_Pass).context_;
  pFVar3 = (this_01->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  local_80 = required_capabilities;
  if (pFVar3 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_01);
    pFVar3 = (this_01->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  local_78.buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.size_ = 0;
  local_78.buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &pFVar3->capabilities_;
  EnumSet<spv::Capability>::cbegin(&local_98,this_00);
  sVar4 = (long)*(pointer *)
                 ((long)&(pFVar3->capabilities_).buckets_.
                         super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                 + 8) -
          *(long *)&(pFVar3->capabilities_).buckets_.
                    super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                    ._M_impl.super__Vector_impl_data >> 4;
  if (((local_98.set_ != this_00) || (local_98.bucketOffset_ != 0)) ||
     (local_98.bucketIndex_ != sVar4)) {
    do {
      local_9c = EnumSet<spv::Capability>::Iterator::operator*(&local_98);
      bVar1 = EnumSet<spv::Capability>::contains(&this->untouchableCapabilities_,local_9c);
      if (((!bVar1) &&
          (bVar1 = EnumSet<spv::Capability>::contains(&this->supportedCapabilities_,local_9c), bVar1
          )) && (bVar1 = EnumSet<spv::Capability>::contains(local_80,local_9c), !bVar1)) {
        EnumSet<spv::Capability>::insert(&local_50,&local_78,&local_9c);
      }
      EnumSet<spv::Capability>::Iterator::operator++(&local_98);
    } while (((local_98.set_ != this_00) || (local_98.bucketOffset_ != 0)) ||
            (local_98.bucketIndex_ != sVar4));
  }
  EnumSet<spv::Capability>::cbegin(&local_50.first,&local_78);
  lVar2 = (long)local_78.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_78.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start;
  sVar4 = local_78.size_;
  while (((local_78.size_ = sVar4, local_50.first.set_ != &local_78 ||
          (local_50.first.bucketOffset_ != 0)) || (local_50.first.bucketIndex_ != lVar2 >> 4))) {
    capability_00 = EnumSet<spv::Capability>::Iterator::operator*(&local_50.first);
    IRContext::RemoveCapability((this->super_Pass).context_,capability_00);
    EnumSet<spv::Capability>::Iterator::operator++(&local_50.first);
    sVar4 = local_78.size_;
  }
  if (local_78.buckets_.
      super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.buckets_.
                    super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.buckets_.
                          super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.buckets_.
                          super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (sVar4 == 0) + SuccessWithChange;
}

Assistant:

Pass::Status TrimCapabilitiesPass::TrimUnrequiredCapabilities(
    const CapabilitySet& required_capabilities) const {
  const FeatureManager* feature_manager = context()->get_feature_mgr();
  CapabilitySet capabilities_to_trim;
  for (auto capability : feature_manager->GetCapabilities()) {
    // Some capabilities cannot be safely removed. Leaving them untouched.
    if (untouchableCapabilities_.contains(capability)) {
      continue;
    }

    // If the capability is unsupported, don't trim it.
    if (!supportedCapabilities_.contains(capability)) {
      continue;
    }

    if (required_capabilities.contains(capability)) {
      continue;
    }

    capabilities_to_trim.insert(capability);
  }

  for (auto capability : capabilities_to_trim) {
    context()->RemoveCapability(capability);
  }

  return capabilities_to_trim.size() == 0 ? Pass::Status::SuccessWithoutChange
                                          : Pass::Status::SuccessWithChange;
}